

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1761::TestCase1761(TestCase1761 *this)

{
  TestCase1761 *this_local;
  
  kj::TestCase::TestCase
            (&this->super_TestCase,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x6e1,"legacy test: Encoding/NameAnnotation");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR_run_005c1368;
  return;
}

Assistant:

TEST(Encoding, NameAnnotation) {
  EXPECT_EQ(2, static_cast<uint16_t>(test::RenamedStruct::RenamedEnum::QUX));
  EXPECT_EQ(2, static_cast<uint16_t>(test::RenamedStruct::RenamedNestedStruct::RenamedDeeplyNestedEnum::GARPLY));

  MallocMessageBuilder message;
  auto root = message.initRoot<test::RenamedStruct>();

  root.setGoodFieldName(true);
  EXPECT_EQ(true, root.getGoodFieldName());
  EXPECT_TRUE(root.isGoodFieldName());

  root.setBar(0xff);
  EXPECT_FALSE(root.isGoodFieldName());

  root.setAnotherGoodFieldName(test::RenamedStruct::RenamedEnum::QUX);
  EXPECT_EQ(test::RenamedStruct::RenamedEnum::QUX, root.getAnotherGoodFieldName());

  EXPECT_FALSE(root.getRenamedUnion().isQux());
  auto quxBuilder = root.getRenamedUnion().initQux();
  EXPECT_TRUE(root.getRenamedUnion().isQux());
  EXPECT_FALSE(root.getRenamedUnion().getQux().hasAnotherGoodNestedFieldName());

  quxBuilder.setGoodNestedFieldName(true);
  EXPECT_EQ(true, quxBuilder.getGoodNestedFieldName());

  EXPECT_FALSE(quxBuilder.hasAnotherGoodNestedFieldName());
  auto nestedFieldBuilder = quxBuilder.initAnotherGoodNestedFieldName();
  EXPECT_TRUE(quxBuilder.hasAnotherGoodNestedFieldName());

  nestedFieldBuilder.setGoodNestedFieldName(true);
  EXPECT_EQ(true, nestedFieldBuilder.getGoodNestedFieldName());
  EXPECT_FALSE(nestedFieldBuilder.hasAnotherGoodNestedFieldName());

  EXPECT_FALSE(root.getRenamedUnion().isRenamedGroup());
  auto renamedGroupBuilder KJ_UNUSED = root.getRenamedUnion().initRenamedGroup();
  EXPECT_TRUE(root.getRenamedUnion().isRenamedGroup());

  test::RenamedInterface::RenamedMethodParams::Reader renamedInterfaceParams;
  renamedInterfaceParams.getRenamedParam();
}